

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int gpioNotifyOpenWithSize(int bufSize)

{
  uint32_t uVar1;
  char *pcVar2;
  uint in_EDI;
  char name [32];
  int fd;
  int slot;
  int i;
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  FILE *pFVar3;
  char local_38 [36];
  int local_14;
  uint local_10;
  uint local_c;
  uint local_8;
  uint local_4;
  
  pFVar3 = _stderr;
  local_8 = in_EDI;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar2 = myTimeStamp();
    fprintf(pFVar3,"%s %s: bufSize=%d\n",pcVar2,"gpioNotifyOpenWithSize",(ulong)local_8);
  }
  pFVar3 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar3,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar2,
              "gpioNotifyOpenWithSize");
    }
    local_4 = 0xffffffe1;
  }
  else {
    local_10 = 0xffffffff;
    notifyMutex(0);
    for (local_c = 0; (int)local_c < 0x20; local_c = local_c + 1) {
      if (gpioNotify[(int)local_c].state == 0) {
        local_10 = local_c;
        gpioNotify[(int)local_c].state = 1;
        break;
      }
    }
    notifyMutex(0);
    pFVar3 = _stderr;
    if ((int)local_10 < 0) {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar2 = myTimeStamp();
        fprintf(pFVar3,"%s %s: no handle\n",pcVar2,"gpioNotifyOpenWithSize");
      }
      local_4 = 0xffffffe8;
    }
    else {
      sprintf(local_38,"/dev/pigpio%d",(ulong)local_10);
      myCreatePipe(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      local_14 = open(local_38,0x802);
      if (local_14 < 0) {
        gpioNotify[(int)local_10].state = 0;
        pFVar3 = _stderr;
        if ((gpioCfg.internals & 0x400) == 0) {
          pcVar2 = myTimeStamp();
          fprintf(pFVar3,"%s %s: open %s failed (%m)\n",pcVar2,"gpioNotifyOpenWithSize",local_38);
        }
        local_4 = 0xffffffe9;
      }
      else if ((local_8 == 0) ||
              (local_c = fcntl(local_14,0x407,(ulong)local_8), local_c == local_8)) {
        gpioNotify[(int)local_10].seqno = 0;
        gpioNotify[(int)local_10].bits = 0;
        gpioNotify[(int)local_10].fd = local_14;
        gpioNotify[(int)local_10].pipe = 1;
        gpioNotify[(int)local_10].max_emits = 0x155;
        uVar1 = gpioTick();
        gpioNotify[(int)local_10].lastReportTick = uVar1;
        gpioNotify[(int)local_c].state = 3;
        closeOrphanedNotifications
                  ((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(int)in_stack_ffffffffffffffa0);
        local_4 = local_10;
      }
      else {
        gpioNotify[(int)local_10].state = 0;
        if ((gpioCfg.internals & 0x400) == 0) {
          pFVar3 = _stderr;
          pcVar2 = myTimeStamp();
          fprintf(pFVar3,"%s %s: fcntl %s size %d failed (%m)\n",pcVar2,"gpioNotifyOpenWithSize",
                  local_38,(ulong)local_8);
        }
        local_4 = 0xffffffe9;
      }
    }
  }
  return local_4;
}

Assistant:

int gpioNotifyOpenWithSize(int bufSize)
{
   int i, slot, fd;
   char name[32];

   DBG(DBG_USER, "bufSize=%d", bufSize);

   CHECK_INITED;

   slot = -1;

   notifyMutex(1);

   for (i=0; i<PI_NOTIFY_SLOTS; i++)
   {
      if (gpioNotify[i].state == PI_NOTIFY_CLOSED)
      {
         slot = i;
         gpioNotify[slot].state = PI_NOTIFY_RESERVED;
         break;
      }
   }

   notifyMutex(0);

   if (slot < 0) SOFT_ERROR(PI_NO_HANDLE, "no handle");

   sprintf(name, "/dev/pigpio%d", slot);

   myCreatePipe(name, 0664);

   fd = open(name, O_RDWR|O_NONBLOCK);

   if (fd < 0)
   {
      gpioNotify[slot].state = PI_NOTIFY_CLOSED;
      SOFT_ERROR(PI_BAD_PATHNAME, "open %s failed (%m)", name);
   }

   if (bufSize != 0)
   {
      i = fcntl(fd, F_SETPIPE_SZ, bufSize);
      if (i != bufSize)
      {
         gpioNotify[slot].state = PI_NOTIFY_CLOSED;
         SOFT_ERROR(PI_BAD_PATHNAME,
            "fcntl %s size %d failed (%m)", name, bufSize);
      }
   }

   gpioNotify[slot].seqno = 0;
   gpioNotify[slot].bits  = 0;
   gpioNotify[slot].fd    = fd;
   gpioNotify[slot].pipe  = 1;
   gpioNotify[slot].max_emits  = MAX_EMITS;
   gpioNotify[slot].lastReportTick = gpioTick();
   gpioNotify[i].state = PI_NOTIFY_OPENED;

   closeOrphanedNotifications(slot, fd);

   return slot;
}